

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall
tonk::gateway::StateMachine::BeginControlSOAPRequests(StateMachine *this,int controlIndex)

{
  vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_> *this_00;
  ushort uVar1;
  short sVar2;
  int iVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pAVar6;
  HTTPRequester *this_01;
  bool bVar7;
  uint64_t nowUsec;
  OutputWorker *pOVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined1 local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  ostringstream local_1a8 [376];
  
  pCVar4 = (this->ControlEndpoints).
           super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  nowUsec = siamese::GetTimeUsec();
  this_00 = &pCVar4[controlIndex].Requests;
  uVar9 = (uint)((ulong)((long)(this->Requests).
                               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Requests).
                              super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (uVar9 != (uint)(((long)(this_00->
                             super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>::
    resize(this_00,(long)(int)uVar9);
  }
  lVar12 = 4;
  lVar10 = 0;
  uVar11 = 0;
  do {
    if ((~((int)uVar9 >> 0x1f) & uVar9) == uVar11) {
      return;
    }
    pCVar5 = (this_00->
             super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar6 = (this->Requests).
             super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(ushort *)((long)pAVar6 + lVar12 + -4);
    iVar3 = *(int *)((long)&pAVar6->LocalPort + lVar12);
    this_01 = *(HTTPRequester **)
               ((long)&(pCVar5->Requester).
                       super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar10);
    if (this_01 == (HTTPRequester *)0x0) {
LAB_0016011d:
      if (*(int *)((long)&pCVar5->LastApp + lVar10) == iVar3) {
LAB_00160127:
        if (iVar3 != 0) goto LAB_00160347;
LAB_0016027f:
        if (((((&pCVar5->AddAgainOnTimer)[lVar10] == true) &&
             (*(short *)((long)&pCVar5->AddedExternalPort + lVar10) != 0)) &&
            (170000000 < nowUsec - *(long *)((long)&pCVar5->LastSuccessUsec + lVar10))) &&
           (*(undefined4 *)((long)&pCVar5->RetriesRemaining + lVar10) = 3, DAT_001d8d30 < 2)) {
          local_1b8 = (undefined1  [8])ModuleLogger;
          _Stack_1b0._M_pi._0_4_ = 1;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,(string *)&DAT_001d8d60);
          std::operator<<((ostream *)local_1a8,"Time to renew the gateway port mapping for local:");
          std::ostream::operator<<((ostream *)local_1a8,uVar1);
          std::operator<<((ostream *)local_1a8," <-> external:");
          std::ostream::operator<<
                    ((ostream *)local_1a8,*(ushort *)((long)&pCVar5->AddedExternalPort + lVar10));
          pOVar8 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
LAB_0016033f:
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
        }
      }
      else {
        *(int *)((long)&pCVar5->LastApp + lVar10) = iVar3;
        sVar2 = *(short *)((long)&pCVar5->AddedExternalPort + lVar10);
        if (iVar3 != 1) {
          if ((iVar3 != 0) || (sVar2 != 0)) goto LAB_00160127;
          *(undefined4 *)((long)&pCVar5->RetriesRemaining + lVar10) = 3;
          if (DAT_001d8d30 < 2) {
            local_1b8 = (undefined1  [8])ModuleLogger;
            _Stack_1b0._M_pi._0_4_ = 1;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,(string *)&DAT_001d8d60);
            std::operator<<((ostream *)local_1a8,"Adding the gateway port mapping for local:");
            std::ostream::operator<<((ostream *)local_1a8,uVar1);
            pOVar8 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
          }
          goto LAB_0016027f;
        }
        if (sVar2 != 0) {
          *(undefined4 *)((long)&pCVar5->RetriesRemaining + lVar10) = 3;
          (&pCVar5->AddAgainOnTimer)[lVar10] = false;
          if (1 < DAT_001d8d30) goto LAB_00160347;
          local_1b8 = (undefined1  [8])ModuleLogger;
          _Stack_1b0._M_pi._0_4_ = 1;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,(string *)&DAT_001d8d60);
          std::operator<<((ostream *)local_1a8,"Removing the gateway port mapping for local:");
          std::ostream::operator<<((ostream *)local_1a8,uVar1);
          std::operator<<((ostream *)local_1a8," <-> external:");
          std::ostream::operator<<
                    ((ostream *)local_1a8,*(ushort *)((long)&pCVar5->AddedExternalPort + lVar10));
          pOVar8 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar8,(LogStringBuffer *)local_1b8);
          goto LAB_0016033f;
        }
      }
LAB_00160347:
      bVar7 = SSDPRequester::IsNetworkDefinitelyDown(this->SSDP);
      if ((!bVar7) && (iVar3 = *(int *)((long)&pCVar5->RetriesRemaining + lVar10), 0 < iVar3)) {
        *(int *)((long)&pCVar5->RetriesRemaining + lVar10) = iVar3 + -1;
        RequestSOAP(this,controlIndex,(int)uVar11);
      }
    }
    else {
      bVar7 = HTTPRequester::OnTick_IsDisposable(this_01,nowUsec);
      if (bVar7) {
        local_1b8 = (undefined1  [8])0x0;
        _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pCVar5->Requester).
                           super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar10),
                   (__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)
                   local_1b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
        goto LAB_0016011d;
      }
    }
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x28;
    lVar12 = lVar12 + 0x10;
  } while( true );
}

Assistant:

void StateMachine::BeginControlSOAPRequests(int controlIndex)
{
    ControlEndpoint& control = ControlEndpoints[controlIndex];

    // Get current time
    const uint64_t nowUsec = siamese::GetTimeUsec();

    // Resize requests
    const int requestCount = (int)Requests.size();
    if (requestCount != (int)control.Requests.size()) {
        control.Requests.resize(requestCount);
    }

    // Check each request
    for (int requestIndex = 0; requestIndex < requestCount; ++requestIndex)
    {
        ControlRequest& controlRequest = control.Requests[requestIndex];
        const AppRequest app = Requests[requestIndex];

        // If HTTP request is already in progress:
        if (nullptr != controlRequest.Requester)
        {
            // If the requester is dead:
            if (controlRequest.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                controlRequest.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // The application request type can fluctuate between Add/Remove at any time.

        // If the app request has changed:
        if (controlRequest.LastApp != app.Type)
        {
            controlRequest.LastApp = app.Type;

            if (app.Type == RequestType::Remove &&
                controlRequest.AddedExternalPort != 0)
            {
                // The app is requesting a remove and we had added a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                // Reset some state in case we want to add it again later
                controlRequest.AddAgainOnTimer = false;

                ModuleLogger.Debug("Removing the gateway port mapping for local:",
                    app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
            }
            else if (app.Type == RequestType::Add &&
                controlRequest.AddedExternalPort == 0)
            {
                // The app is requesting to add and we do not have a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                ModuleLogger.Debug("Adding the gateway port mapping for local:",
                    app.LocalPort);
            }
        }

        // If an external port was added successfully some time ago:
        if (app.Type == RequestType::Add &&
            controlRequest.AddAgainOnTimer &&
            controlRequest.AddedExternalPort != 0 &&
            nowUsec - controlRequest.LastSuccessUsec > protocol::kUPnPLeaseRenewSecs * 1000 * 1000)
        {
            /*
                Keep retrying forever after the lease renew interval elapses.

                This handles the case where the network goes down after a port
                is mapped, so the LAN info is still unchanged in Windows (same
                Local IP and same Gateway).  While the network is down, this
                causes continuous HTTP requests from the control endpoint about
                once per second until the uplink is restored or the LAN changes.

                LAN changes clear the AddAgainOnTimer flag to exit this loop.
            */
            controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

            ModuleLogger.Debug("Time to renew the gateway port mapping for local:",
                app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
        }

        // If the network is definitely down avoid sending queries:
        if (SSDP->IsNetworkDefinitelyDown()) {
            continue;
        }

        // If there are no more retries:
        if (controlRequest.RetriesRemaining <= 0) {
            continue; // Do not retry
        }
        controlRequest.RetriesRemaining--;

        // If retries are remaining then we should perform a request
        RequestSOAP(controlIndex, requestIndex);
    }
}